

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Int_t * Gia_ManSortCoBySuppSize(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  uint uVar1;
  int iVar2;
  word *pData;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  uint *__ptr;
  void *pvVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar1 = p->vCos->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar9 = uVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar9;
  if (uVar9 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar9 * 4);
  }
  p_00->pArray = piVar4;
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  *__ptr = uVar9;
  if (uVar9 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar9 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  if (0 < vSupps->nSize) {
    uVar1 = __ptr[1];
    uVar9 = *__ptr;
    lVar6 = 4;
    uVar8 = 0;
    lVar7 = 0;
    do {
      iVar2 = *(int *)((long)&vSupps->pArray->nCap + lVar6);
      uVar3 = uVar9;
      if (uVar1 + (int)lVar7 == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar5;
          uVar10 = 0x10;
        }
        else {
          uVar10 = uVar9 * 2;
          if ((int)uVar10 <= (int)uVar9) goto LAB_001f265e;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc((ulong)uVar10 << 3);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar10 << 3);
          }
          *(void **)(__ptr + 2) = pvVar5;
        }
        uVar3 = uVar10;
        if (pvVar5 == (void *)0x0) {
          __ptr[1] = uVar1 + (int)lVar7;
          *__ptr = uVar9;
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
      }
LAB_001f265e:
      uVar9 = uVar3;
      *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8 + lVar7 * 8) = (long)iVar2 | uVar8;
      lVar7 = lVar7 + 1;
      uVar8 = uVar8 + 0x100000000;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < vSupps->nSize);
    __ptr[1] = (int)lVar7 + uVar1;
    *__ptr = uVar9;
  }
  pData = *(word **)(__ptr + 2);
  uVar1 = __ptr[1];
  Abc_QuickSort3(pData,uVar1,1);
  if (0 < (long)(int)uVar1) {
    lVar6 = 0;
    do {
      Vec_IntPush(p_00,*(int *)((long)pData + lVar6 * 8 + 4));
      lVar6 = lVar6 + 1;
    } while ((int)uVar1 != lVar6);
  }
  if (pData != (word *)0x0) {
    free(pData);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSortCoBySuppSize( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Vec_Int_t * vOrder = Vec_IntAlloc( Gia_ManCoNum(p) );
    Vec_Wrd_t * vSortData = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Vec_Int_t * vSuppOne; word Entry; int i;
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_WrdPush( vSortData, ((word)i << 32) | Vec_IntSize(vSuppOne) );
    Abc_QuickSort3( Vec_WrdArray(vSortData), Vec_WrdSize(vSortData), 1 );
    Vec_WrdForEachEntry( vSortData, Entry, i )
        Vec_IntPush( vOrder, (int)(Entry >> 32) );
    Vec_WrdFree( vSortData );
    return vOrder;
}